

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_access_ptr(Integer g_a,Integer *lo,Integer *hi,void *ptr,Integer *ld)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  logical lVar6;
  long lVar7;
  size_t sVar8;
  Integer IVar9;
  ushort uVar10;
  long lVar11;
  undefined4 uVar12;
  long lVar13;
  global_array_t *pgVar14;
  char *__s;
  long lVar15;
  long lVar16;
  long lVar17;
  Integer _d;
  long lVar18;
  Integer ow;
  long local_1e8;
  Integer local_1e0;
  long local_1d8;
  long local_1d0;
  long *local_1c8;
  long *local_1c0;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  
  iVar5 = GA[g_a + 1000].p_handle;
  lVar18 = (long)iVar5;
  local_1e0 = g_a;
  local_1c8 = ld;
  lVar6 = pnga_locate(g_a,lo,&ow);
  if (lVar6 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar5 != -1) {
    ow = (Integer)PGRP_LIST[lVar18].inv_map_proc_list[ow];
  }
  local_1c0 = (long *)ptr;
  iVar3 = armci_domain_id(0,(int)ow);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (ow != GAme)) {
    pnga_error("cannot access top of the patch",ow);
  }
  lVar6 = pnga_locate(local_1e0,hi,&ow);
  if (lVar6 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if (iVar5 != -1) {
    ow = (Integer)PGRP_LIST[lVar18].inv_map_proc_list[ow];
  }
  lVar17 = local_1e0 + 1000;
  local_1d8 = lVar18;
  local_1d0 = g_a * 0x368;
  iVar5 = armci_domain_id(0,(int)ow);
  iVar3 = armci_domain_my_id(0);
  if ((iVar5 != iVar3) && (ow != GAme)) {
    pnga_error("cannot access bottom of the patch",ow);
  }
  lVar17 = lVar17 * 0x368;
  lVar18 = 0;
  pgVar14 = GA;
  local_1e8 = lVar17;
  while( true ) {
    lVar2 = local_1d0;
    uVar1 = *(ushort *)((long)pgVar14->dims + lVar17 + -0x30);
    lVar7 = (long)(short)uVar1;
    if (lVar7 <= lVar18) break;
    if (hi[lVar18] < lo[lVar18]) {
      builtin_strncpy(err_string,"cannot locate region: ",0x17);
      strcpy(err_string + 0x16,pgVar14->name + lVar17);
      sVar8 = strlen(err_string);
      sprintf(err_string + (int)sVar8," [%ld:%ld ",*lo,*hi);
      sVar8 = strlen(err_string);
      for (lVar17 = 1; __s = err_string + (int)sVar8,
          lVar17 < *(short *)((long)GA->dims + local_1e8 + -0x30); lVar17 = lVar17 + 1) {
        sprintf(__s,",%ld:%ld ",lo[lVar17],hi[lVar17]);
        sVar8 = strlen(err_string);
      }
      __s[0] = ']';
      __s[1] = '\0';
      pnga_error(err_string,local_1e0);
      pgVar14 = GA;
      lVar17 = local_1e8;
    }
    lVar18 = lVar18 + 1;
  }
  if (-1 < (int)local_1d8) {
    ow = (Integer)PGRP_LIST[local_1d8].map_proc_list[ow];
  }
  if (0 < *(long *)((long)pgVar14->old_nblock + lVar17 + -0x30)) {
    ow = *(Integer *)(*(long *)((long)pgVar14->old_nblock + lVar17 + -0x18) + ow * 8);
  }
  iVar5 = *(int *)((long)pgVar14->block_dims + lVar17 + -4);
  lVar18 = lVar17;
  if (iVar5 - 1U < 3) {
    lVar13 = (long)(int)ow % *(long *)((long)pgVar14->num_blocks + lVar17);
    uVar12 = (undefined4)lVar13;
    err_string[0] = (char)uVar12;
    err_string[1] = (char)((uint)uVar12 >> 8);
    err_string[2] = (char)((uint)uVar12 >> 0x10);
    err_string[3] = (char)((uint)uVar12 >> 0x18);
    IVar9 = ow;
    lVar17 = 0;
    while (lVar17 + 1 < lVar7) {
      IVar9 = (long)((int)IVar9 - (int)lVar13) /
              *(long *)((long)pgVar14[1000].num_blocks + lVar17 * 8 + local_1d0);
      lVar13 = (long)(int)IVar9 %
               *(long *)((long)pgVar14[1000].num_blocks + lVar17 * 8 + local_1d0 + 8);
      *(int *)(err_string + lVar17 * 4 + 4) = (int)lVar13;
      lVar17 = lVar17 + 1;
    }
    lVar17 = 0;
    uVar10 = 0;
    if (0 < (short)uVar1) {
      uVar10 = uVar1;
    }
    for (; (ulong)uVar10 * 4 != lVar17; lVar17 = lVar17 + 4) {
      iVar5 = *(int *)(err_string + lVar17);
      lVar13 = *(long *)((long)pgVar14[1000].block_dims + lVar17 * 2 + local_1d0);
      *(long *)((long)_lo + lVar17 * 2) = lVar13 * iVar5 + 1;
      lVar13 = ((long)iVar5 + 1) * lVar13;
      *(long *)((long)_hi + lVar17 * 2) = lVar13;
      lVar11 = *(long *)((long)pgVar14[1000].dims + lVar17 * 2 + local_1d0);
      if (lVar11 <= lVar13) {
        lVar13 = lVar11;
      }
      *(long *)((long)_hi + lVar17 * 2) = lVar13;
    }
  }
  else if (iVar5 == 4) {
    lVar11 = (long)(int)ow % *(long *)((long)pgVar14->num_blocks + lVar17);
    uVar12 = (undefined4)lVar11;
    err_string[0] = (char)uVar12;
    err_string[1] = (char)((uint)uVar12 >> 8);
    err_string[2] = (char)((uint)uVar12 >> 0x10);
    err_string[3] = (char)((uint)uVar12 >> 0x18);
    IVar9 = ow;
    lVar13 = 0;
    while (lVar13 + 1 < lVar7) {
      IVar9 = (long)((int)IVar9 - (int)lVar11) /
              *(long *)((long)pgVar14[1000].num_blocks + lVar13 * 8 + local_1d0);
      lVar11 = (long)(int)IVar9 %
               *(long *)((long)pgVar14[1000].num_blocks + lVar13 * 8 + local_1d0 + 8);
      *(int *)(err_string + lVar13 * 4 + 4) = (int)lVar11;
      lVar13 = lVar13 + 1;
    }
    lVar13 = 0;
    uVar10 = 0;
    if (0 < (short)uVar1) {
      uVar10 = uVar1;
    }
    iVar5 = 0;
    for (; (ulong)uVar10 * 4 != lVar13; lVar13 = lVar13 + 4) {
      lVar18 = *(long *)(pgVar14->name + lVar17 + -8);
      iVar3 = *(int *)(err_string + lVar13);
      lVar11 = (long)iVar5 + (long)iVar3;
      *(undefined8 *)((long)_lo + lVar13 * 2) = *(undefined8 *)(lVar18 + lVar11 * 8);
      if ((long)iVar3 < *(long *)((long)pgVar14->num_blocks + lVar13 * 2 + lVar17) + -1) {
        lVar18 = *(long *)(lVar18 + 8 + lVar11 * 8) + -1;
      }
      else {
        lVar18 = *(long *)((long)pgVar14->dims + lVar13 * 2 + lVar17);
      }
      *(long *)((long)_hi + lVar13 * 2) = lVar18;
      iVar5 = iVar5 + *(int *)((long)pgVar14->num_blocks + lVar13 * 2 + lVar17);
      lVar18 = local_1e8;
    }
  }
  else if (iVar5 == 0) {
    lVar13 = *(long *)((long)pgVar14->old_nblock + lVar17 + -0x30);
    if (lVar13 == 0) {
      lVar11 = 0;
      lVar13 = 0;
      if (0 < lVar7) {
        lVar13 = lVar7;
      }
      lVar15 = 1;
      for (; lVar13 != lVar11; lVar11 = lVar11 + 1) {
        lVar15 = lVar15 * *(int *)((long)pgVar14[1000].nblock + lVar11 * 4 + local_1d0);
      }
      if (ow < lVar15 && -1 < ow) {
        lVar11 = 0;
        IVar9 = ow;
        for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 1) {
          lVar16 = (long)*(int *)((long)pgVar14[1000].nblock + lVar15 * 4 + local_1d0);
          lVar18 = (IVar9 % lVar16) * 8 + *(long *)(pgVar14->name + lVar17 + -8);
          _lo[lVar15] = *(Integer *)(lVar18 + lVar11 * 8);
          if (IVar9 % lVar16 == lVar16 + -1) {
            lVar18 = *(long *)((long)pgVar14[1000].dims + lVar15 * 8 + local_1d0);
          }
          else {
            lVar18 = *(long *)(lVar18 + 8 + lVar11 * 8) + -1;
          }
          lVar11 = lVar11 + lVar16;
          _hi[lVar15] = lVar18;
          IVar9 = IVar9 / lVar16;
          lVar18 = local_1e8;
        }
      }
      else {
        for (lVar17 = 0; lVar13 != lVar17; lVar17 = lVar17 + 1) {
          _lo[lVar17] = 0;
          _hi[lVar17] = -1;
        }
      }
    }
    else if (ow < lVar13) {
      lVar11 = 0;
      lVar13 = 0;
      if (0 < lVar7) {
        lVar13 = lVar7;
      }
      lVar15 = 1;
      for (; lVar13 != lVar11; lVar11 = lVar11 + 1) {
        lVar15 = lVar15 * *(int *)((long)pgVar14[1000].nblock + lVar11 * 4 + local_1d0);
      }
      if ((ow < 0) || (lVar15 <= ow)) {
        for (lVar17 = 0; lVar13 != lVar17; lVar17 = lVar17 + 1) {
          _lo[lVar17] = 0;
          _hi[lVar17] = -1;
        }
      }
      else {
        lVar15 = 0;
        IVar9 = ow;
        for (lVar11 = 0; lVar13 != lVar11; lVar11 = lVar11 + 1) {
          lVar16 = (long)*(int *)((long)pgVar14[1000].nblock + lVar11 * 4 + local_1d0);
          lVar18 = (IVar9 % lVar16) * 8 + *(long *)(pgVar14->name + lVar17 + -8);
          _lo[lVar11] = *(Integer *)(lVar18 + lVar15 * 8);
          if (IVar9 % lVar16 == lVar16 + -1) {
            lVar18 = *(long *)((long)pgVar14[1000].dims + lVar11 * 8 + local_1d0);
          }
          else {
            lVar18 = *(long *)(lVar18 + 8 + lVar15 * 8) + -1;
          }
          lVar15 = lVar15 + lVar16;
          _hi[lVar11] = lVar18;
          IVar9 = IVar9 / lVar16;
          lVar18 = local_1e8;
        }
      }
    }
    else {
      lVar17 = 0;
      iVar5 = 0;
      if (0 < (short)uVar1) {
        iVar5 = (int)(short)uVar1;
      }
      for (; iVar5 != lVar17; lVar17 = lVar17 + 1) {
        _lo[lVar17] = 0;
        _hi[lVar17] = -1;
      }
    }
  }
  lVar17 = lVar7 + -1;
  local_1e0 = lVar7;
  for (lVar13 = 0; lVar13 < *(short *)((long)pgVar14->dims + lVar18 + -0x30); lVar13 = lVar13 + 1) {
    if (_hi[lVar13] < lo[lVar13] || lo[lVar13] < _lo[lVar13]) {
      sprintf(err_string,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error(err_string,lVar13);
      pgVar14 = GA;
      lVar18 = local_1e8;
    }
  }
  if (lVar17 == 0) {
    *local_1c8 = (_hi[0] - _lo[0]) + *(long *)((long)pgVar14->width + lVar18) * 2 + 1;
  }
  lVar7 = 0;
  if (lVar17 < 1) {
    lVar17 = lVar7;
  }
  lVar13 = 1;
  lVar11 = 0;
  for (; lVar17 != lVar7; lVar7 = lVar7 + 1) {
    lVar15 = *(long *)((long)pgVar14[1000].width + lVar7 * 8 + lVar2);
    lVar16 = ((lVar15 * 2 + 1) - _lo[lVar7]) + _hi[lVar7];
    lVar11 = lVar11 + ((lVar15 + lo[lVar7]) - _lo[lVar7]) * lVar13;
    local_1c8[lVar7] = lVar16;
    lVar13 = lVar13 * lVar16;
  }
  if (*(int *)((long)pgVar14->block_dims + lVar18 + -0x18) == 0) {
    ow = (Integer)PGRP_LIST->inv_map_proc_list[ow];
  }
  else if (*(long *)((long)pgVar14->old_nblock + lVar18 + -0x30) != 0) {
    ow = *(long *)(*(long *)((long)pgVar14->old_nblock + lVar18 + -0x38) + ow * 8);
  }
  *local_1c0 = (long)*(int *)((long)pgVar14->dims + lVar18 + -0x18) *
               (((lo[local_1e0 + -1] - _lo[local_1e0 + -1]) +
                *(long *)((long)pgVar14->width + local_1e0 * 8 + lVar18 + -8)) * lVar13 + lVar11) +
               *(long *)(*(long *)(pgVar14->name + lVar18 + -0x10) + ow * 8);
  return;
}

Assistant:

void pnga_access_ptr(Integer g_a, Integer lo[], Integer hi[],
                      void* ptr, Integer ld[])
{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;

   
   p_handle = GA[handle].p_handle;
   if (!pnga_locate(g_a,lo,&ow)) pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if (!pnga_locate(g_a,hi, &ow)) pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme))
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   if (p_handle >= 0) {
     ow = PGRP_LIST[p_handle].map_proc_list[ow];
   }
   if (GA[handle].num_rstrctd > 0) {
     ow = GA[handle].rank_rstrctd[ow];
   }
   gam_Location(ow,handle, lo, &lptr, ld);
   *(char**)ptr = lptr; 
}